

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

void __thiscall QtFontStyle::Key::Key(Key *this,QString *styleString)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ushort uVar4;
  short sVar5;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QLatin1StringView s_05;
  QArrayDataPointer<char16_t> local_100;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QStringView local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->field_0x2 = 0;
  *(undefined2 *)this = 0x640;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLower_helper((QString *)&local_58);
  local_88.d = (Data *)0x6;
  local_88.ptr = L"normal";
  bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_88);
  if (bVar1) {
LAB_00424a04:
    sVar5 = 400;
  }
  else {
    local_a8.d = (Data *)0x7;
    local_a8.ptr = L"regular";
    bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_a8);
    sVar5 = 400;
    if (!bVar1) {
      local_88.d = (Data *)0x4;
      local_88.ptr = L"bold";
      bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_88);
      sVar5 = 700;
      if (!bVar1) {
        local_88.d = (Data *)&DAT_00000008;
        local_88.ptr = L"semibold";
        bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_88);
        if (!bVar1) {
          local_a8.d = (Data *)&DAT_00000009;
          local_a8.ptr = L"semi bold";
          bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_a8);
          if (!bVar1) {
            local_c8.d = (Data *)&DAT_00000008;
            local_c8.ptr = L"demibold";
            bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_c8);
            if (!bVar1) {
              local_e8.d = (Data *)&DAT_00000009;
              local_e8.ptr = L"demi bold";
              bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_e8);
              sVar5 = 600;
              if (!bVar1) {
                local_88.d = (Data *)0x6;
                local_88.ptr = L"medium";
                bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_88);
                sVar5 = 500;
                if (!bVar1) {
                  local_88.d = (Data *)0x5;
                  local_88.ptr = L"black";
                  bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_88);
                  sVar5 = 900;
                  if (!bVar1) {
                    local_88.d = (Data *)0x5;
                    local_88.ptr = L"light";
                    bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_88);
                    sVar5 = 300;
                    if (!bVar1) {
                      local_88.d = (Data *)0x4;
                      local_88.ptr = L"thin";
                      bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_88);
                      if (bVar1) {
LAB_00424d31:
                        sVar5 = 100;
                      }
                      else {
                        local_88.d = (Data *)local_58.size;
                        local_88.ptr = local_58.ptr;
                        local_68 = QStringView::mid((QStringView *)&local_88,2,-1);
                        cVar2 = QString::startsWith((QLatin1String *)&local_58,2);
                        if ((cVar2 == '\0') &&
                           (cVar2 = QString::startsWith((QLatin1String *)&local_58,2), cVar2 == '\0'
                           )) {
LAB_00424e83:
                          s_01.m_data = "bold";
                          s_01.m_size = 4;
                          bVar1 = QString::contains((QString *)&local_58,s_01,CaseSensitive);
                          if (bVar1) {
                            s_02.m_data = "demi";
                            s_02.m_size = 4;
                            bVar1 = QString::contains((QString *)&local_58,s_02,CaseSensitive);
                            sVar5 = 700;
                            if (bVar1) {
                              sVar5 = 600;
                            }
                          }
                          else {
                            s_03.m_data = "thin";
                            s_03.m_size = 4;
                            bVar1 = QString::contains((QString *)&local_58,s_03,CaseSensitive);
                            if (bVar1) goto LAB_00424d31;
                            s_04.m_data = "light";
                            s_04.m_size = 5;
                            bVar1 = QString::contains((QString *)&local_58,s_04,CaseSensitive);
                            sVar5 = 300;
                            if (!bVar1) {
                              s_05.m_data = "black";
                              s_05.m_size = 5;
                              bVar1 = QString::contains((QString *)&local_58,s_05,CaseSensitive);
                              sVar5 = 900;
                              if (!bVar1) {
                                QCoreApplication::translate
                                          ((char *)&local_88,"QFontDatabase","Normal",0x5f6798);
                                iVar3 = QString::compare((QString *)&local_58,
                                                         (CaseSensitivity)&local_88);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
                                if (iVar3 == 0) goto LAB_00424a04;
                                local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                                local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                                local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                                QCoreApplication::translate
                                          ((char *)&local_a8,"QFontDatabase","Bold",0);
                                QString::toLower_helper((QString *)&local_88);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
                                bVar1 = ::comparesEqual((QString *)&local_58,(QString *)&local_88);
                                sVar5 = 700;
                                if (!bVar1) {
                                  QCoreApplication::translate
                                            ((char *)&local_a8,"QFontDatabase","Demi Bold",0);
                                  iVar3 = QString::compare((QString *)&local_58,
                                                           (CaseSensitivity)&local_a8);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
                                  if (iVar3 == 0) {
                                    sVar5 = 600;
                                  }
                                  else {
                                    QCoreApplication::translate
                                              ((char *)&local_a8,"QFontDatabase","Medium",0x5f67cb);
                                    iVar3 = QString::compare((QString *)&local_58,
                                                             (CaseSensitivity)&local_a8);
                                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
                                    if (iVar3 == 0) {
                                      sVar5 = 500;
                                    }
                                    else {
                                      QCoreApplication::translate
                                                ((char *)&local_a8,"QFontDatabase","Black",0);
                                      iVar3 = QString::compare((QString *)&local_58,
                                                               (CaseSensitivity)&local_a8);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
                                      if (iVar3 == 0) {
                                        sVar5 = 900;
                                      }
                                      else {
                                        local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                                        local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                                        local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                                        QCoreApplication::translate
                                                  ((char *)&local_c8,"QFontDatabase","Light",0);
                                        QString::toLower_helper((QString *)&local_a8);
                                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
                                        bVar1 = ::comparesEqual((QString *)&local_58,
                                                                (QString *)&local_a8);
                                        sVar5 = 300;
                                        if (!bVar1) {
                                          QCoreApplication::translate
                                                    ((char *)&local_c8,"QFontDatabase","Thin",0);
                                          iVar3 = QString::compare((QString *)&local_58,
                                                                   (CaseSensitivity)&local_c8);
                                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8)
                                          ;
                                          if (iVar3 == 0) {
                                            sVar5 = 100;
                                          }
                                          else {
                                            QCoreApplication::translate
                                                      ((char *)&local_c8,"QFontDatabase",
                                                       "Extra Light",0);
                                            iVar3 = QString::compare((QString *)&local_58,
                                                                     (CaseSensitivity)&local_c8);
                                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                      (&local_c8);
                                            if (iVar3 == 0) {
                                              sVar5 = 200;
                                            }
                                            else {
                                              QCoreApplication::translate
                                                        ((char *)&local_c8,"QFontDatabase",
                                                         "Extra Bold",0);
                                              iVar3 = QString::compare((QString *)&local_58,
                                                                       (CaseSensitivity)&local_c8);
                                              QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                        (&local_c8);
                                              if (iVar3 == 0) {
                                                sVar5 = 800;
                                              }
                                              else {
                                                local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                                                local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                                                local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                                                QCoreApplication::translate
                                                          ((char *)&local_e8,"QFontDatabase","Extra"
                                                           ,0);
                                                QString::toLower_helper((QString *)&local_c8);
                                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                          (&local_e8);
                                                bVar1 = QString::contains((QString *)&local_58,
                                                                          (QString *)&local_88,
                                                                          CaseSensitive);
                                                if (bVar1) {
                                                  local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                                                  local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                                                  local_e8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                                                  QCoreApplication::translate
                                                            ((char *)&local_100,"QFontDatabase",
                                                             "Demi",0);
                                                  QString::toLower_helper((QString *)&local_e8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_100);
                                                  bVar1 = QString::contains((QString *)&local_58,
                                                                            (QString *)&local_e8,
                                                                            CaseSensitive);
                                                  sVar5 = 600;
                                                  if (!bVar1) {
                                                    bVar1 = QString::contains((QString *)&local_58,
                                                                              (QString *)&local_c8,
                                                                              CaseSensitive);
                                                    sVar5 = 700;
                                                    if (bVar1) {
                                                      sVar5 = 800;
                                                    }
                                                  }
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_e8);
                                                }
                                                else {
                                                  bVar1 = QString::contains((QString *)&local_58,
                                                                            (QString *)&local_a8,
                                                                            CaseSensitive);
                                                  sVar5 = 400;
                                                  if (bVar1) {
                                                    bVar1 = QString::contains((QString *)&local_58,
                                                                              (QString *)&local_c8,
                                                                              CaseSensitive);
                                                    sVar5 = 300;
                                                    if (bVar1) {
                                                      sVar5 = 200;
                                                    }
                                                  }
                                                }
                                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                          (&local_c8);
                                              }
                                            }
                                          }
                                        }
                                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
                                      }
                                    }
                                  }
                                }
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
                              }
                            }
                          }
                        }
                        else {
                          local_88.d = (Data *)&DAT_00000008;
                          local_88.ptr = L"tralight";
                          bVar1 = ::comparesEqual((QLatin1StringView *)&local_88,&local_68);
                          if (bVar1) {
                            sVar5 = 200;
                          }
                          else {
                            local_a8.d = (Data *)&DAT_00000009;
                            local_a8.ptr = L"tra light";
                            bVar1 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_a8
                                                );
                            sVar5 = 200;
                            if (!bVar1) {
                              local_88.d = (Data *)0x7;
                              local_88.ptr = L"trabold";
                              bVar1 = ::comparesEqual((QLatin1StringView *)&local_88,&local_68);
                              if (bVar1) {
                                sVar5 = 800;
                              }
                              else {
                                local_a8.d = (Data *)&DAT_00000008;
                                local_a8.ptr = L"tra bold";
                                bVar1 = ::comparesEqual((QLatin1StringView *)&local_a8,&local_68);
                                sVar5 = 800;
                                if (!bVar1) goto LAB_00424e83;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_00424afb;
            }
          }
        }
        sVar5 = 600;
      }
    }
  }
LAB_00424afb:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  *(ushort *)this = ((ushort)*(undefined3 *)this & 0xf003) + sVar5 * 4;
  if ((styleString->d).size != 0) {
    s.m_data = "Italic";
    s.m_size = 6;
    bVar1 = QString::contains(styleString,s,CaseSensitive);
    uVar4 = 1;
    if (!bVar1) {
      s_00.m_data = "Oblique";
      s_00.m_size = 7;
      bVar1 = QString::contains(styleString,s_00,CaseSensitive);
      uVar4 = 2;
      if (!bVar1) {
        QCoreApplication::translate((char *)&local_58,"QFontDatabase","Italic",0);
        bVar1 = QString::contains(styleString,(QString *)&local_58,CaseSensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        uVar4 = 1;
        if (!bVar1) {
          QCoreApplication::translate((char *)&local_58,"QFontDatabase","Oblique",0);
          bVar1 = QString::contains(styleString,(QString *)&local_58,CaseSensitive);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          uVar4 = 2;
          if (!bVar1) goto LAB_00424c0c;
        }
      }
    }
    *(ushort *)this = (ushort)*(undefined3 *)this & 0xfffc | uVar4;
  }
LAB_00424c0c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QtFontStyle::Key::Key(const QString &styleString)
    : style(QFont::StyleNormal), weight(QFont::Normal), stretch(0)
{
    weight = getFontWeight(styleString);

    if (!styleString.isEmpty()) {
        // First the straightforward no-translation checks, these are fast.
        if (styleString.contains("Italic"_L1))
            style = QFont::StyleItalic;
        else if (styleString.contains("Oblique"_L1))
            style = QFont::StyleOblique;

        // Then the translation checks. These aren't as fast.
        else if (styleString.contains(QCoreApplication::translate("QFontDatabase", "Italic")))
            style = QFont::StyleItalic;
        else if (styleString.contains(QCoreApplication::translate("QFontDatabase", "Oblique")))
            style = QFont::StyleOblique;
    }
}